

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlSBufFinish(xmlSBuf *buf,int *sizeOut,xmlParserCtxtPtr ctxt,char *errMsg)

{
  xmlChar *pxVar1;
  char *errMsg_local;
  xmlParserCtxtPtr ctxt_local;
  int *sizeOut_local;
  xmlSBuf *buf_local;
  
  if (buf->mem == (xmlChar *)0x0) {
    pxVar1 = (xmlChar *)(*xmlMalloc)(1);
    buf->mem = pxVar1;
    if (buf->mem == (xmlChar *)0x0) {
      buf->code = XML_ERR_NO_MEMORY;
    }
    else {
      *buf->mem = '\0';
    }
  }
  else {
    buf->mem[buf->size] = '\0';
  }
  if (buf->code == XML_ERR_OK) {
    if (sizeOut != (int *)0x0) {
      *sizeOut = buf->size;
    }
    buf_local = (xmlSBuf *)buf->mem;
  }
  else {
    xmlSBufReportError(buf,ctxt,errMsg);
    (*xmlFree)(buf->mem);
    if (sizeOut != (int *)0x0) {
      *sizeOut = 0;
    }
    buf_local = (xmlSBuf *)0x0;
  }
  return (xmlChar *)buf_local;
}

Assistant:

static xmlChar *
xmlSBufFinish(xmlSBuf *buf, int *sizeOut, xmlParserCtxtPtr ctxt,
              const char *errMsg) {
    if (buf->mem == NULL) {
        buf->mem = xmlMalloc(1);
        if (buf->mem == NULL) {
            buf->code = XML_ERR_NO_MEMORY;
        } else {
            buf->mem[0] = 0;
        }
    } else {
        buf->mem[buf->size] = 0;
    }

    if (buf->code == XML_ERR_OK) {
        if (sizeOut != NULL)
            *sizeOut = buf->size;
        return(buf->mem);
    }

    xmlSBufReportError(buf, ctxt, errMsg);

    xmlFree(buf->mem);

    if (sizeOut != NULL)
        *sizeOut = 0;
    return(NULL);
}